

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O2

size_type __thiscall re2::StringPiece::find(StringPiece *this,char c,size_type pos)

{
  char *pcVar1;
  size_type sVar2;
  ulong uVar3;
  char c_local;
  
  uVar3 = (ulong)this->length_;
  sVar2 = 0xffffffffffffffff;
  if ((0 < (long)uVar3) && (pos < uVar3)) {
    c_local = c;
    pcVar1 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (this->ptr_ + pos,this->ptr_ + uVar3,&c_local);
    sVar2 = 0xffffffffffffffff;
    if (pcVar1 != this->ptr_ + this->length_) {
      sVar2 = (long)pcVar1 - (long)this->ptr_;
    }
  }
  return sVar2;
}

Assistant:

StringPiece::size_type StringPiece::find(char c, size_type pos) const {
  if (length_ <= 0 || pos >= static_cast<size_type>(length_)) {
    return npos;
  }
  const char* result = std::find(ptr_ + pos, ptr_ + length_, c);
  return result != ptr_ + length_ ? result - ptr_ : npos;
}